

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GTestPluginManager.cpp
# Opt level: O0

void __thiscall
TestPluginManagerPathResolution_FallsbackOnDefault_Config_Test::TestBody
          (TestPluginManagerPathResolution_FallsbackOnDefault_Config_Test *this)

{
  bool bVar1;
  char *message;
  char *in_R9;
  path *local_230;
  string local_208;
  AssertHelper local_1e8;
  Message local_1e0;
  bool local_1d1;
  undefined1 local_1d0 [8];
  AssertionResult gtest_ar_;
  path local_1b8;
  undefined1 local_190 [40];
  undefined1 local_168 [8];
  initializer_list<std::filesystem::__cxx11::path> expectedPaths;
  undefined1 local_130 [8];
  path resolvedPathCombined;
  undefined1 local_e8 [8];
  path resolvedPath;
  undefined1 local_98 [8];
  path configPath;
  path expectedDefaultPath;
  allocator<char> local_31;
  undefined1 local_30 [8];
  string configFile;
  TestPluginManagerPathResolution_FallsbackOnDefault_Config_Test *this_local;
  
  configFile.field_2._8_8_ = this;
  unsetenv("PLUGIN_CONFIG_PATH");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_30,"pluginlist.pb.txt",&local_31);
  std::allocator<char>::~allocator(&local_31);
  plugin::detail::GetApplicationPath_abi_cxx11_();
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            ((path *)&resolvedPath._M_cmpts,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30,
             auto_format);
  std::filesystem::__cxx11::operator/
            ((path *)local_98,(path *)&configPath._M_cmpts,(path *)&resolvedPath._M_cmpts);
  std::filesystem::__cxx11::path::~path((path *)&resolvedPath._M_cmpts);
  std::__cxx11::string::string((string *)&resolvedPathCombined._M_cmpts,(string *)local_30);
  plugin::PluginManager::ResolveConfigPath
            ((path *)local_e8,(string *)&resolvedPathCombined._M_cmpts);
  std::__cxx11::string::~string((string *)&resolvedPathCombined._M_cmpts);
  plugin::detail::GetApplicationPath_abi_cxx11_();
  std::filesystem::__cxx11::operator/
            ((path *)local_130,(path *)&expectedPaths._M_len,(path *)local_e8);
  std::filesystem::__cxx11::path::~path((path *)&expectedPaths._M_len);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )&local_1b8;
  std::filesystem::__cxx11::path::path
            ((path *)gtest_ar_.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl,(path *)local_e8);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )local_190;
  std::filesystem::__cxx11::path::path
            ((path *)gtest_ar_.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl,(path *)local_130);
  local_168 = (undefined1  [8])&local_1b8;
  expectedPaths._M_array = (iterator)0x2;
  local_1d1 = (anonymous_namespace)::
              IsIn<std::filesystem::__cxx11::path,std::filesystem::__cxx11::path,(anonymous_namespace)::__0>
                        (local_98,local_168);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1d0,&local_1d1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d0);
  if (!bVar1) {
    testing::Message::Message(&local_1e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_208,(internal *)local_1d0,(AssertionResult *)"IsIn(configPath, expectedPaths)"
               ,"false","true",in_R9);
    message = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidachon[P]PluginManager/Test/GTestPluginManager.cpp"
               ,0xef,message);
    testing::internal::AssertHelper::operator=(&local_1e8,&local_1e0);
    testing::internal::AssertHelper::~AssertHelper(&local_1e8);
    std::__cxx11::string::~string((string *)&local_208);
    testing::Message::~Message(&local_1e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d0);
  local_230 = (path *)local_168;
  do {
    local_230 = local_230 + -1;
    std::filesystem::__cxx11::path::~path(local_230);
  } while (local_230 != &local_1b8);
  std::filesystem::__cxx11::path::~path((path *)local_130);
  std::filesystem::__cxx11::path::~path((path *)local_e8);
  std::filesystem::__cxx11::path::~path((path *)local_98);
  std::filesystem::__cxx11::path::~path((path *)&configPath._M_cmpts);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

TEST(TestPluginManagerPathResolution, FallsbackOnDefault_Config)
{
    unsetenv("PLUGIN_CONFIG_PATH");
    std::string const configFile{"pluginlist.pb.txt"};
    auto const expectedDefaultPath = plugin::detail::GetApplicationPath();
    auto const configPath = expectedDefaultPath / configFile;

    auto const resolvedPath = plugin::PluginManager::ResolveConfigPath(configFile);
    auto const resolvedPathCombined = plugin::detail::GetApplicationPath() / resolvedPath;

    auto const expectedPaths = {resolvedPath, resolvedPathCombined};
    EXPECT_TRUE(IsIn(configPath, expectedPaths));
}